

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftbsdf.c
# Opt level: O1

FT_Error finalize_sdf(BSDF_Worker *worker,FT_Bitmap *target)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  FT_Error FVar6;
  ulong uVar7;
  char cVar8;
  uint uVar9;
  char cVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  uchar *puVar16;
  ulong uVar17;
  long local_50;
  
  FVar6 = 6;
  if (worker != (BSDF_Worker *)0x0) {
    uVar1 = target->width;
    uVar17 = (ulong)uVar1;
    FVar6 = 6;
    if (uVar1 == worker->width) {
      uVar2 = target->rows;
      if (uVar2 == worker->rows) {
        if (0 < (int)uVar2) {
          puVar16 = target->buffer;
          iVar4 = (worker->params).spread * 0x10000;
          local_50 = 0;
          uVar12 = 0;
          do {
            if (0 < (int)uVar1) {
              uVar15 = 0;
              lVar13 = local_50;
              do {
                iVar5 = *(int *)((long)&worker->distance_map->dist + lVar13);
                iVar3 = iVar4;
                if (iVar5 < iVar4) {
                  iVar3 = iVar5;
                }
                if (iVar5 < 0) {
                  iVar3 = iVar4;
                }
                iVar5 = -iVar3;
                if (((worker->params).flip_sign == '\0') !=
                    (&worker->distance_map->alpha)[lVar13] < 0x7f) {
                  iVar5 = iVar3;
                }
                uVar7 = FT_DivFix((long)iVar5,(long)iVar4);
                iVar5 = (int)uVar7;
                uVar14 = (ulong)(uint)-iVar5;
                if (0 < iVar5) {
                  uVar14 = uVar7 & 0xffffffff;
                }
                uVar9 = (uint)(uVar14 >> 9);
                uVar11 = 0x7f;
                if ((uint)uVar14 < 0x10000) {
                  uVar11 = uVar9;
                }
                if (0 < iVar5) {
                  uVar9 = uVar11;
                }
                cVar10 = (char)uVar9;
                if (0x7f < uVar9) {
                  cVar10 = -0x80;
                }
                cVar8 = (char)uVar9;
                if (iVar5 < 0) {
                  cVar8 = -cVar10;
                }
                puVar16[uVar15] = cVar8 + 0x80;
                uVar15 = uVar15 + 1;
                lVar13 = lVar13 + 0x20;
              } while (uVar17 != uVar15);
            }
            uVar12 = uVar12 + 1;
            local_50 = local_50 + uVar17 * 0x20;
            puVar16 = puVar16 + uVar17;
          } while (uVar12 != uVar2);
        }
        FVar6 = 0;
      }
    }
  }
  return FVar6;
}

Assistant:

static FT_Error
  finalize_sdf( BSDF_Worker*      worker,
                const FT_Bitmap*  target )
  {
    FT_Error  error = FT_Err_Ok;

    FT_Int  w, r;
    FT_Int  i, j;

    FT_SDFFormat*  t_buffer;
    FT_16D16       sp_sq, spread;


    if ( !worker || !target )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    w        = (int)target->width;
    r        = (int)target->rows;
    t_buffer = (FT_SDFFormat*)target->buffer;

    if ( w != worker->width ||
         r != worker->rows  )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    spread = (FT_16D16)FT_INT_16D16( worker->params.spread );

#if USE_SQUARED_DISTANCES
    sp_sq = (FT_16D16)FT_INT_16D16( worker->params.spread *
                                    worker->params.spread );
#else
    sp_sq = (FT_16D16)FT_INT_16D16( worker->params.spread );
#endif

    for ( j = 0; j < r; j++ )
    {
      for ( i = 0; i < w; i++ )
      {
        FT_Int        index;
        FT_16D16      dist;
        FT_SDFFormat  final_dist;
        FT_Char       sign;


        index = j * w + i;
        dist  = worker->distance_map[index].dist;

        if ( dist < 0 || dist > sp_sq )
          dist = sp_sq;

#if USE_SQUARED_DISTANCES
        dist = square_root( dist );
#endif

        /* We assume that if the pixel is inside a contour */
        /* its coverage value must be > 127.               */
        sign = worker->distance_map[index].alpha < 127 ? -1 : 1;

        /* flip the sign according to the property */
        if ( worker->params.flip_sign )
          sign = -sign;

        /* concatenate from 16.16 to appropriate format */
        final_dist = map_fixed_to_sdf( dist * sign, spread );

        t_buffer[index] = final_dist;
      }
    }

  Exit:
    return error;
  }